

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

Token nexttoken(Context_conflict2 *ctx)

{
  int iVar1;
  Token TVar2;
  undefined8 in_RAX;
  char *pcVar3;
  uint line;
  undefined8 uStack_38;
  
  if (ctx->pushedback == 0) {
    uStack_38 = in_RAX;
    pcVar3 = preprocessor_nexttoken(ctx->preprocessor,&ctx->tokenlen,&ctx->tokenval);
    ctx->token = pcVar3;
    iVar1 = preprocessor_outofmemory(ctx->preprocessor);
    if (iVar1 == 0) {
      do {
        pcVar3 = preprocessor_sourcepos(ctx->preprocessor,(uint *)((long)&uStack_38 + 4));
        ctx->current_file = pcVar3;
        ctx->current_position = uStack_38._4_4_;
        TVar2 = ctx->tokenval;
        if (TVar2 == TOKEN_BAD_CHARS) {
          pcVar3 = "Bad characters in source file";
        }
        else {
          if (TVar2 != TOKEN_PREPROCESSING_ERROR) {
            return TVar2;
          }
          pcVar3 = ctx->token;
        }
        failf(ctx,"%s",pcVar3);
        pcVar3 = preprocessor_nexttoken(ctx->preprocessor,&ctx->tokenlen,&ctx->tokenval);
        ctx->token = pcVar3;
        iVar1 = preprocessor_outofmemory(ctx->preprocessor);
      } while (iVar1 == 0);
    }
    ctx->token = (char *)0x0;
    ctx->tokenlen = 0;
    ctx->tokenval = TOKEN_EOI;
    TVar2 = TOKEN_EOI;
  }
  else {
    ctx->pushedback = 0;
    TVar2 = ctx->tokenval;
  }
  return TVar2;
}

Assistant:

static Token nexttoken(Context *ctx)
{
    if (ctx->pushedback)
        ctx->pushedback = 0;
    else
    {
        while (1)
        {
            ctx->token = preprocessor_nexttoken(ctx->preprocessor,
                                                &ctx->tokenlen,
                                                &ctx->tokenval);

            if (preprocessor_outofmemory(ctx->preprocessor))
            {
                ctx->tokenval = TOKEN_EOI;
                ctx->token = NULL;
                ctx->tokenlen = 0;
                break;
            } // if

            unsigned int line;
            ctx->current_file = preprocessor_sourcepos(ctx->preprocessor,&line);
            ctx->current_position = (int) line;

            if (ctx->tokenval == TOKEN_BAD_CHARS)
            {
                fail(ctx, "Bad characters in source file");
                continue;
            } // else if

            else if (ctx->tokenval == TOKEN_PREPROCESSING_ERROR)
            {
                fail(ctx, ctx->token);
                continue;
            } // else if

            break;
        } // while
    } // else

    print_debug_token(ctx->token, ctx->tokenlen, ctx->tokenval);
    return ctx->tokenval;
}